

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::DragBehaviorT<double,double,double>
               (ImGuiDataType data_type,double *v,float v_speed,double v_min,double v_max,
               char *format,ImGuiSliderFlags flags)

{
  double dVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  ImGuiKey IVar7;
  ImGuiAxis axis;
  undefined4 uVar8;
  float fVar9;
  undefined4 uVar10;
  float fVar11;
  double dVar12;
  float fVar13;
  double dVar14;
  
  pIVar2 = GImGui;
  dVar1 = v_max - v_min;
  if ((v_speed == 0.0 && v_min < v_max) && (dVar1 < 3.4028234663852886e+38)) {
    v_speed = (float)((double)GImGui->DragSpeedDefaultRatio * dVar1);
  }
  axis = (flags & 0x100000U) >> 0x14;
  uVar5 = data_type & 0xfffffffe;
  if (((GImGui->ActiveIdSource == ImGuiInputSource_Mouse) &&
      (bVar3 = IsMousePosValid((ImVec2 *)0x0), bVar3)) &&
     (bVar3 = IsMouseDragPastThreshold(0,(pIVar2->IO).MouseDragThreshold * 0.5), bVar3)) {
    fVar13 = *(float *)((pIVar2->IO).MouseDown + (ulong)(uint)axis * 4 + -0x18);
    if ((pIVar2->IO).KeyAlt != false) {
      fVar13 = fVar13 * 0.01;
    }
    if ((pIVar2->IO).KeyShift == true) {
      fVar13 = fVar13 * 10.0;
    }
  }
  else {
    fVar13 = 0.0;
    if ((pIVar2->ActiveIdSource & ~ImGuiInputSource_Mouse) == ImGuiInputSource_Keyboard) {
      iVar6 = 0;
      if (uVar5 == 8) {
        iVar6 = ImParseFormatPrecision(format,3);
      }
      IVar7 = ImGuiKey_ModCtrl;
      if (pIVar2->NavInputSource == ImGuiInputSource_Gamepad) {
        IVar7 = ImGuiKey_GamepadL1;
      }
      bVar3 = IsKeyDown(IVar7);
      IVar7 = ImGuiKey_ModShift;
      if (pIVar2->NavInputSource == ImGuiInputSource_Gamepad) {
        IVar7 = ImGuiKey_GamepadR1;
      }
      bVar4 = IsKeyDown(IVar7);
      if (bVar4) {
        fVar11 = 10.0;
      }
      else {
        fVar11 = 1.0;
      }
      if (bVar3) {
        fVar11 = 0.1;
      }
      fVar13 = GetNavTweakPressedAmount(axis);
      fVar13 = fVar13 * fVar11;
      fVar11 = GetMinimumStepAtDecimalPrecision(iVar6);
      v_speed = (float)((uint)v_speed & -(uint)(fVar11 <= v_speed) |
                       ~-(uint)(fVar11 <= v_speed) & (uint)fVar11);
    }
  }
  fVar13 = fVar13 * v_speed;
  if ((flags & 0x100000U) != 0) {
    fVar13 = -fVar13;
  }
  if ((((flags & 0x20U) != 0) && (dVar1 < 3.4028234663852886e+38)) &&
     (9.999999974752427e-07 < dVar1)) {
    fVar13 = fVar13 / (float)dVar1;
  }
  if (v_min < v_max && (flags & 0x100U) == 0) {
    if ((v_max <= *v) && (0.0 < fVar13)) goto LAB_001a42f8;
    bVar3 = fVar13 < 0.0 && *v <= v_min;
  }
  else {
    bVar3 = false;
  }
  if ((pIVar2->ActiveIdIsJustActivated == false) && (!bVar3)) {
    if ((fVar13 != 0.0) || (NAN(fVar13))) {
      pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum + fVar13;
      pIVar2->DragCurrentAccumDirty = true;
    }
    else if ((pIVar2->DragCurrentAccumDirty & 1U) == 0) {
      return false;
    }
    dVar14 = *v;
    if ((flags & 0x20U) == 0) {
      dVar14 = dVar14 + (double)pIVar2->DragCurrentAccum;
      fVar9 = 0.0;
      fVar11 = 0.0;
    }
    else {
      if (uVar5 == 8) {
        iVar6 = ImParseFormatPrecision(format,3);
        fVar11 = (float)iVar6;
      }
      else {
        fVar11 = 1.0;
      }
      fVar9 = powf(0.1,fVar11);
      fVar11 = ScaleRatioFromValueT<double,double,double>
                         (data_type,dVar14,v_min,v_max,true,fVar9,0.0);
      dVar14 = ScaleValueFromRatioT<double,double,double>
                         (data_type,pIVar2->DragCurrentAccum + fVar11,v_min,v_max,true,fVar9,0.0);
    }
    if ((flags & 0x40U) == 0 && uVar5 == 8) {
      dVar14 = RoundScalarWithFormatT<double>(format,data_type,dVar14);
    }
    pIVar2->DragCurrentAccumDirty = false;
    if ((flags & 0x20U) == 0) {
      dVar12 = *v;
      uVar8 = SUB84(dVar12,0);
      uVar10 = (undefined4)((ulong)dVar12 >> 0x20);
      pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum - (float)(dVar14 - dVar12);
    }
    else {
      fVar9 = ScaleRatioFromValueT<double,double,double>
                        (data_type,dVar14,v_min,v_max,true,fVar9,0.0);
      pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum - (fVar9 - fVar11);
      uVar8 = SUB84(*v,0);
      uVar10 = (undefined4)((ulong)*v >> 0x20);
    }
    dVar14 = (double)(~-(ulong)(dVar14 == 0.0) & (ulong)dVar14);
    if (v_min < v_max) {
      if (((double)CONCAT44(uVar10,uVar8) != dVar14) ||
         (NAN((double)CONCAT44(uVar10,uVar8)) || NAN(dVar14))) {
        if ((v_min < v_max & (byte)((uint)flags >> 8) & 1) == 0) {
          if ((dVar14 < v_min) ||
             (((uVar5 != 8 &&
               ((double)CONCAT44(uVar10,uVar8) <= dVar14 && dVar14 != (double)CONCAT44(uVar10,uVar8)
               )) && (fVar13 < 0.0)))) {
            dVar14 = v_min;
          }
          if ((v_max < dVar14) ||
             (((uVar5 != 8 &&
               (dVar14 <= (double)CONCAT44(uVar10,uVar8) && (double)CONCAT44(uVar10,uVar8) != dVar14
               )) && (0.0 < fVar13)))) {
            dVar14 = v_max;
          }
        }
        else {
          if (uVar5 == 8) {
            dVar12 = 0.0;
          }
          else {
            dVar12 = 1.0;
          }
          dVar14 = (double)(~-(ulong)(dVar14 < v_min) & (ulong)dVar14 |
                           (ulong)(dVar1 + dVar12 + dVar14) & -(ulong)(dVar14 < v_min));
          if (v_max < dVar14) {
            dVar14 = dVar14 - (dVar1 + dVar12);
          }
        }
      }
    }
    if (((double)CONCAT44(uVar10,uVar8) == dVar14) &&
       (!NAN((double)CONCAT44(uVar10,uVar8)) && !NAN(dVar14))) {
      return false;
    }
    *v = dVar14;
    return true;
  }
LAB_001a42f8:
  pIVar2->DragCurrentAccum = 0.0;
  pIVar2->DragCurrentAccumDirty = false;
  return false;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_bounded = (v_min < v_max);
    const bool is_wrapped = is_bounded && (flags & ImGuiSliderFlags_WrapAround);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    // Default tweak speed
    if (v_speed == 0.0f && is_bounded && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && IsMouseDragPastThreshold(0, g.IO.MouseDragThreshold * DRAG_MOUSE_THRESHOLD_FACTOR))
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Keyboard || g.ActiveIdSource == ImGuiInputSource_Gamepad)
    {
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
        const bool tweak_slow = IsKeyDown((g.NavInputSource == ImGuiInputSource_Gamepad) ? ImGuiKey_NavGamepadTweakSlow : ImGuiKey_NavKeyboardTweakSlow);
        const bool tweak_fast = IsKeyDown((g.NavInputSource == ImGuiInputSource_Gamepad) ? ImGuiKey_NavGamepadTweakFast : ImGuiKey_NavKeyboardTweakFast);
        const float tweak_factor = tweak_slow ? 1.0f / 10.0f : tweak_fast ? 10.0f : 1.0f;
        adjust_delta = GetNavTweakPressedAmount(axis) * tweak_factor;
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // For logarithmic use our range is effectively 0..1 so scale the delta into that range
    if (is_logarithmic && (v_max - v_min < FLT_MAX) && ((v_max - v_min) > 0.000001f)) // Epsilon to avoid /0
        adjust_delta /= (float)(v_max - v_min);

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    const bool is_just_activated = g.ActiveIdIsJustActivated;
    const bool is_already_past_limits_and_pushing_outward = is_bounded && !is_wrapped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    if (is_just_activated || is_already_past_limits_and_pushing_outward)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    const float zero_deadzone_halfsize = 0.0f; // Drag widgets have no deadzone (as it doesn't make sense)
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);

        // Convert to parametric space, apply delta, convert back
        float v_old_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        float v_new_parametric = v_old_parametric + g.DragCurrentAccum;
        v_cur = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new_parametric, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        v_old_ref_for_accum_remainder = v_old_parametric;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    if (is_floating_point && !(flags & ImGuiSliderFlags_NoRoundToFormat))
        v_cur = RoundScalarWithFormatT<TYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_logarithmic)
    {
        // Convert to parametric space, apply delta, convert back
        float v_new_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        g.DragCurrentAccum -= (float)(v_new_parametric - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    if (*v != v_cur && is_bounded)
    {
        if (is_wrapped)
        {
            // Wrap values
            if (v_cur < v_min)
                v_cur += v_max - v_min + (is_floating_point ? 0 : 1);
            if (v_cur > v_max)
                v_cur -= v_max - v_min + (is_floating_point ? 0 : 1);
        }
        else
        {
            // Clamp values + handle overflow/wrap-around for integer types.
            if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_floating_point))
                v_cur = v_min;
            if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_floating_point))
                v_cur = v_max;
        }
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}